

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::AddString(cmCommandArgumentParserHelper *this,string *str)

{
  char *stVal;
  cmCommandArgumentParserHelper *local_20;
  
  if (str->_M_string_length != 0) {
    local_20 = (cmCommandArgumentParserHelper *)operator_new__(str->_M_string_length + 1);
    strcpy((char *)local_20,(str->_M_dataplus)._M_p);
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              (&this->Variables,(value_type *)&local_20);
    this = local_20;
  }
  return this->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::AddString(const std::string& str)
{
  if (str.empty()) {
    return this->EmptyVariable;
  }
  char* stVal = new char[str.size() + 1];
  strcpy(stVal, str.c_str());
  this->Variables.push_back(stVal);
  return stVal;
}